

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

void stbtt__handle_clipped_edge
               (float *scanline,int x,stbtt__active_edge *e,float x0,float y0,float x1,float y1)

{
  int ln;
  char *pcVar1;
  float fVar2;
  float fVar3;
  
  if ((y0 == y1) && (!NAN(y0) && !NAN(y1))) {
    return;
  }
  if (y1 <= y0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                ,0xb7b,"stbtt__handle_clipped_edge","ImGui ASSERT FAILED: %s","y0 < y1");
  }
  fVar2 = e->ey;
  if (fVar2 < e->sy) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                ,0xb7c,"stbtt__handle_clipped_edge","ImGui ASSERT FAILED: %s","e->sy <= e->ey");
    fVar2 = e->ey;
  }
  if (fVar2 < y0) {
    return;
  }
  fVar3 = e->sy;
  if (y1 < fVar3) {
    return;
  }
  if (y0 < fVar3) {
    x0 = x0 + ((fVar3 - y0) * (x1 - x0)) / (y1 - y0);
    y0 = fVar3;
  }
  if (fVar2 < y1) {
    x1 = x1 + ((fVar2 - y1) * (x1 - x0)) / (y1 - y0);
    y1 = fVar2;
  }
  fVar2 = (float)x;
  fVar3 = (float)(x + 1);
  if ((x0 != fVar2) || (NAN(x0) || NAN(fVar2))) {
    if ((x0 != fVar3) || (NAN(x0) || NAN(fVar3))) {
      if (x0 <= fVar2) {
        if (x1 <= fVar2) goto LAB_001d46e2;
        pcVar1 = "x1 <= x";
        ln = 0xb8d;
      }
      else if (fVar3 <= x0) {
        if (fVar3 <= x1) goto LAB_001d46e2;
        pcVar1 = "x1 >= x+1";
        ln = 0xb8f;
      }
      else {
        if ((fVar2 <= x1) && (x1 <= fVar3)) goto LAB_001d46e2;
        pcVar1 = "x1 >= x && x1 <= x+1";
        ln = 0xb91;
      }
    }
    else {
      if (fVar2 <= x1) goto LAB_001d46e2;
      pcVar1 = "x1 >= x";
      ln = 0xb8b;
    }
  }
  else {
    if (x1 <= fVar3) goto LAB_001d46e2;
    pcVar1 = "x1 <= x+1";
    ln = 0xb89;
  }
  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
              ,ln,"stbtt__handle_clipped_edge","ImGui ASSERT FAILED: %s",pcVar1);
LAB_001d46e2:
  if ((fVar2 < x0) || (fVar2 < x1)) {
    if ((x0 < fVar3) || (x1 < fVar3)) {
      if ((((x0 < fVar2) || (fVar3 < x0)) || (x1 < fVar2)) || (fVar3 < x1)) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_truetype.h"
                    ,0xb98,"stbtt__handle_clipped_edge","ImGui ASSERT FAILED: %s",
                    "x0 >= x && x0 <= x+1 && x1 >= x && x1 <= x+1");
      }
      scanline[x] = (((x1 - fVar2) + (x0 - fVar2)) * -0.5 + 1.0) * (y1 - y0) * e->direction +
                    scanline[x];
    }
  }
  else {
    scanline[x] = (y1 - y0) * e->direction + scanline[x];
  }
  return;
}

Assistant:

static void stbtt__handle_clipped_edge(float *scanline, int x, stbtt__active_edge *e, float x0, float y0, float x1, float y1)
{
   if (y0 == y1) return;
   STBTT_assert(y0 < y1);
   STBTT_assert(e->sy <= e->ey);
   if (y0 > e->ey) return;
   if (y1 < e->sy) return;
   if (y0 < e->sy) {
      x0 += (x1-x0) * (e->sy - y0) / (y1-y0);
      y0 = e->sy;
   }
   if (y1 > e->ey) {
      x1 += (x1-x0) * (e->ey - y1) / (y1-y0);
      y1 = e->ey;
   }

   if (x0 == x)
      STBTT_assert(x1 <= x+1);
   else if (x0 == x+1)
      STBTT_assert(x1 >= x);
   else if (x0 <= x)
      STBTT_assert(x1 <= x);
   else if (x0 >= x+1)
      STBTT_assert(x1 >= x+1);
   else
      STBTT_assert(x1 >= x && x1 <= x+1);

   if (x0 <= x && x1 <= x)
      scanline[x] += e->direction * (y1-y0);
   else if (x0 >= x+1 && x1 >= x+1)
      ;
   else {
      STBTT_assert(x0 >= x && x0 <= x+1 && x1 >= x && x1 <= x+1);
      scanline[x] += e->direction * (y1-y0) * (1-((x0-x)+(x1-x))/2); // coverage = 1 - average x position
   }
}